

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O0

bool from_issue_342::test_uintwide_t_spot_values_from_issue_342_mix(void)

{
  wide_integer *pwVar1;
  uintwide_t<128U,_unsigned_int,_void,_true> *puVar2;
  enable_if_t<(true____true),_int> *in_R8;
  undefined1 auStack_2bc [3];
  bool result_divmod_is_ok_2;
  bool result_mm_is_ok_2;
  bool result_mp_is_ok_2;
  bool result_pm_is_ok_2;
  bool result_pp_is_ok_2;
  representation_type local_2ac;
  undefined1 local_29c [8];
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_mm_2;
  undefined1 local_26c [8];
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_mp_2;
  undefined1 local_23c [8];
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_pm_2;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_pp_2;
  local_int128_t b_2;
  local_int128_t a_2;
  undefined1 auStack_1d4 [3];
  bool result_divmod_is_ok_1;
  bool result_mm_is_ok_1;
  bool result_mp_is_ok_1;
  bool result_pm_is_ok_1;
  bool result_pp_is_ok_1;
  representation_type local_1c4;
  undefined1 local_1b4 [8];
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_mm_1;
  undefined1 local_184 [8];
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_mp_1;
  undefined1 local_154 [8];
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_pm_1;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_pp_1;
  local_int128_t b_1;
  local_int128_t a_1;
  undefined1 auStack_ec [3];
  bool result_divmod_is_ok;
  bool result_mm_is_ok;
  bool result_mp_is_ok;
  bool result_pm_is_ok;
  bool result_pp_is_ok;
  representation_type local_dc;
  undefined1 local_cc [8];
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_mm;
  undefined1 local_9c [8];
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_mp;
  undefined1 local_6c [8];
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_pm;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_pp;
  local_int128_t b;
  local_int128_t a;
  bool result_is_ok;
  
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::uintwide_t<int>
            ((uintwide_t<128U,_unsigned_int,_void,_true> *)
             (b.values.super_array<unsigned_int,_4UL>.elems + 2),0x11,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::uintwide_t<int>
            ((uintwide_t<128U,_unsigned_int,_void,_true> *)
             (r_pp.second.values.super_array<unsigned_int,_4UL>.elems + 2),4,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  pwVar1 = (wide_integer *)
           math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                      (b.values.super_array<unsigned_int,_4UL>.elems + 2));
  puVar2 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                      (r_pp.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
              *)(r_pm.second.values.super_array<unsigned_int,_4UL>.elems + 2),pwVar1,puVar2,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  pwVar1 = (wide_integer *)
           math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                      (b.values.super_array<unsigned_int,_4UL>.elems + 2));
  join_0x00000010_0x00000000_ =
       (value_type_conflict  [4])
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                  (r_pp.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
              *)local_6c,pwVar1,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)
             (r_mp.second.values.super_array<unsigned_int,_4UL>.elems + 2),
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  join_0x00000010_0x00000000_ =
       (value_type_conflict  [4])
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                  (b.values.super_array<unsigned_int,_4UL>.elems + 2));
  puVar2 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                      (r_pp.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
              *)local_9c,
             (wide_integer *)(r_mm.second.values.super_array<unsigned_int,_4UL>.elems + 2),puVar2,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_dc.super_array<unsigned_int,_4UL>.elems =
       (array<unsigned_int,_4UL>)
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                  (b.values.super_array<unsigned_int,_4UL>.elems + 2));
  _auStack_ec = (value_type_conflict  [4])
                math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                          ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                           (r_pp.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
              *)local_cc,(wide_integer *)&local_dc,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)auStack_ec,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::uintwide_t<int>
            ((uintwide_t<128U,_unsigned_int,_void,_true> *)
             (b_1.values.super_array<unsigned_int,_4UL>.elems + 2),0xc,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::uintwide_t<int>
            ((uintwide_t<128U,_unsigned_int,_void,_true> *)
             (r_pp_1.second.values.super_array<unsigned_int,_4UL>.elems + 2),3,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  pwVar1 = (wide_integer *)
           math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                      (b_1.values.super_array<unsigned_int,_4UL>.elems + 2));
  puVar2 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                      (r_pp_1.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
              *)(r_pm_1.second.values.super_array<unsigned_int,_4UL>.elems + 2),pwVar1,puVar2,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  pwVar1 = (wide_integer *)
           math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                      (b_1.values.super_array<unsigned_int,_4UL>.elems + 2));
  join_0x00000010_0x00000000_ =
       (value_type_conflict  [4])
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                  (r_pp_1.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
              *)local_154,pwVar1,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)
             (r_mp_1.second.values.super_array<unsigned_int,_4UL>.elems + 2),
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  join_0x00000010_0x00000000_ =
       (value_type_conflict  [4])
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                  (b_1.values.super_array<unsigned_int,_4UL>.elems + 2));
  puVar2 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                      (r_pp_1.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
              *)local_184,
             (wide_integer *)(r_mm_1.second.values.super_array<unsigned_int,_4UL>.elems + 2),puVar2,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_1c4.super_array<unsigned_int,_4UL>.elems =
       (array<unsigned_int,_4UL>)
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                  (b_1.values.super_array<unsigned_int,_4UL>.elems + 2));
  _auStack_1d4 = (value_type_conflict  [4])
                 math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                           ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                            (r_pp_1.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
              *)local_1b4,(wide_integer *)&local_1c4,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)auStack_1d4,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::uintwide_t<int>
            ((uintwide_t<128U,_unsigned_int,_void,_true> *)
             (b_2.values.super_array<unsigned_int,_4UL>.elems + 2),0x20,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::uintwide_t<int>
            ((uintwide_t<128U,_unsigned_int,_void,_true> *)
             (r_pp_2.second.values.super_array<unsigned_int,_4UL>.elems + 2),0x73,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  pwVar1 = (wide_integer *)
           math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                      (b_2.values.super_array<unsigned_int,_4UL>.elems + 2));
  puVar2 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                      (r_pp_2.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
              *)(r_pm_2.second.values.super_array<unsigned_int,_4UL>.elems + 2),pwVar1,puVar2,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  pwVar1 = (wide_integer *)
           math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                      (b_2.values.super_array<unsigned_int,_4UL>.elems + 2));
  join_0x00000010_0x00000000_ =
       (value_type_conflict  [4])
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                  (r_pp_2.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
              *)local_23c,pwVar1,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)
             (r_mp_2.second.values.super_array<unsigned_int,_4UL>.elems + 2),
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  join_0x00000010_0x00000000_ =
       (value_type_conflict  [4])
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                  (b_2.values.super_array<unsigned_int,_4UL>.elems + 2));
  puVar2 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator+
                     ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                      (r_pp_2.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
              *)local_26c,
             (wide_integer *)(r_mm_2.second.values.super_array<unsigned_int,_4UL>.elems + 2),puVar2,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_2ac.super_array<unsigned_int,_4UL>.elems =
       (array<unsigned_int,_4UL>)
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                  (b_2.values.super_array<unsigned_int,_4UL>.elems + 2));
  _auStack_2bc = (value_type_conflict  [4])
                 math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                           ((uintwide_t<128U,_unsigned_int,_void,_true> *)
                            (r_pp_2.second.values.super_array<unsigned_int,_4UL>.elems + 2));
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            ((pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
              *)local_29c,(wide_integer *)&local_2ac,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)auStack_2bc,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  return true;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_342_mix() -> bool
  {
    // See also: https://github.com/ckormanyos/wide-integer/issues/342

    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_int128_t = WIDE_INTEGER_NAMESPACE::math::wide_integer::int128_t;
    #else
    using local_int128_t = ::math::wide_integer::int128_t;
    #endif

    auto result_is_ok = true;

    {
      const local_int128_t a = 17;
      const local_int128_t b =  4;

      const auto r_pp = divmod(+a, +b);
      const auto r_pm = divmod(+a, -b);
      const auto r_mp = divmod(-a, +b);
      const auto r_mm = divmod(-a, -b);

      const auto result_pp_is_ok = ((r_pp.first == +4) && (r_pp.second == +1));
      const auto result_pm_is_ok = ((r_pm.first == -5) && (r_pm.second == -3));
      const auto result_mp_is_ok = ((r_mp.first == -5) && (r_mp.second == +3));
      const auto result_mm_is_ok = ((r_mm.first == +4) && (r_mm.second == -1));

      const auto result_divmod_is_ok =
      (
           result_pp_is_ok
        && result_pm_is_ok
        && result_mp_is_ok
        && result_mm_is_ok
      );

      result_is_ok = (result_divmod_is_ok && result_is_ok);
    }

    {
      const local_int128_t a = 12;
      const local_int128_t b =  3;

      const auto r_pp = divmod(+a, +b);
      const auto r_pm = divmod(+a, -b);
      const auto r_mp = divmod(-a, +b);
      const auto r_mm = divmod(-a, -b);

      const auto result_pp_is_ok = ((r_pp.first == +4) && (r_pp.second == 0));
      const auto result_pm_is_ok = ((r_pm.first == -4) && (r_pm.second == 0));
      const auto result_mp_is_ok = ((r_mp.first == -4) && (r_mp.second == 0));
      const auto result_mm_is_ok = ((r_mm.first == +4) && (r_mm.second == 0));

      const auto result_divmod_is_ok =
      (
           result_pp_is_ok
        && result_pm_is_ok
        && result_mp_is_ok
        && result_mm_is_ok
      );

      result_is_ok = (result_divmod_is_ok && result_is_ok);
    }

    {
      const local_int128_t a =  32;
      const local_int128_t b = 115;

      const auto r_pp = divmod(+a, +b);
      const auto r_pm = divmod(+a, -b);
      const auto r_mp = divmod(-a, +b);
      const auto r_mm = divmod(-a, -b);

      const auto result_pp_is_ok = ((r_pp.first == +0) && (r_pp.second == +32));
      const auto result_pm_is_ok = ((r_pm.first == -1) && (r_pm.second == -83));
      const auto result_mp_is_ok = ((r_mp.first == -1) && (r_mp.second == +83));
      const auto result_mm_is_ok = ((r_mm.first == +0) && (r_mm.second == -32));

      const auto result_divmod_is_ok =
      (
           result_pp_is_ok
        && result_pm_is_ok
        && result_mp_is_ok
        && result_mm_is_ok
      );

      result_is_ok = (result_divmod_is_ok && result_is_ok);
    }

    return result_is_ok;
  }